

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O0

char * luaO_pushvfstring(lua_State *L,char *fmt,__va_list_tag *argp)

{
  char cVar1;
  uint uVar2;
  double *pdVar3;
  char *str;
  __va_list_tag *str_00;
  char *pcVar4;
  int iVar5;
  size_t sVar6;
  undefined8 *local_118;
  undefined8 *local_f8;
  int *local_d8;
  undefined4 *local_c0;
  long *local_98;
  char local_78 [4];
  int l;
  char buff_1 [40];
  TValue *io_1;
  TValue *io;
  char *pcStack_38;
  char buff;
  char *s;
  char *e;
  __va_list_tag *p_Stack_20;
  int n;
  __va_list_tag *argp_local;
  char *fmt_local;
  lua_State *L_local;
  
  e._4_4_ = 0;
  p_Stack_20 = argp;
  argp_local = (__va_list_tag *)fmt;
  fmt_local = (char *)L;
  do {
    s = strchr((char *)argp_local,0x25);
    if (s == (char *)0x0) {
      if (*(long *)(fmt_local + 0x30) - *(long *)(fmt_local + 0x10) >> 4 < 2) {
        luaD_growstack((lua_State *)fmt_local,1);
      }
      pcVar4 = fmt_local;
      str_00 = argp_local;
      sVar6 = strlen((char *)argp_local);
      pushstr((lua_State *)pcVar4,(char *)str_00,sVar6);
      if (0 < e._4_4_) {
        luaV_concat((lua_State *)fmt_local,e._4_4_ + 1);
      }
      return (char *)(*(long *)(*(long *)(fmt_local + 0x10) + -0x10) + 0x18);
    }
    if (*(long *)(fmt_local + 0x30) - *(long *)(fmt_local + 0x10) >> 4 < 3) {
      luaD_growstack((lua_State *)fmt_local,2);
    }
    pushstr((lua_State *)fmt_local,(char *)argp_local,(long)s - (long)argp_local);
    pcVar4 = fmt_local;
    cVar1 = s[1];
    if (cVar1 == '%') {
      pushstr((lua_State *)fmt_local,"%",1);
    }
    else if (cVar1 == 'c') {
      uVar2 = p_Stack_20->gp_offset;
      if (uVar2 < 0x29) {
        local_c0 = (undefined4 *)((long)(int)uVar2 + (long)p_Stack_20->reg_save_area);
        p_Stack_20->gp_offset = uVar2 + 8;
      }
      else {
        local_c0 = (undefined4 *)p_Stack_20->overflow_arg_area;
        p_Stack_20->overflow_arg_area = local_c0 + 2;
      }
      io._7_1_ = (undefined1)*local_c0;
      pushstr((lua_State *)fmt_local,(char *)((long)&io + 7),1);
    }
    else if (cVar1 == 'd') {
      pdVar3 = *(double **)(fmt_local + 0x10);
      *(double **)(fmt_local + 0x10) = pdVar3 + 2;
      uVar2 = p_Stack_20->gp_offset;
      if (uVar2 < 0x29) {
        local_d8 = (int *)((long)(int)uVar2 + (long)p_Stack_20->reg_save_area);
        p_Stack_20->gp_offset = uVar2 + 8;
      }
      else {
        local_d8 = (int *)p_Stack_20->overflow_arg_area;
        p_Stack_20->overflow_arg_area = local_d8 + 2;
      }
      *pdVar3 = (double)*local_d8;
      *(undefined4 *)(pdVar3 + 1) = 3;
    }
    else if (cVar1 == 'f') {
      buff_1._32_8_ = *(undefined8 *)(fmt_local + 0x10);
      *(undefined8 **)(fmt_local + 0x10) = (undefined8 *)(buff_1._32_8_ + 0x10);
      uVar2 = p_Stack_20->fp_offset;
      if (uVar2 < 0xa1) {
        local_f8 = (undefined8 *)((long)(int)uVar2 + (long)p_Stack_20->reg_save_area);
        p_Stack_20->fp_offset = uVar2 + 0x10;
      }
      else {
        local_f8 = (undefined8 *)p_Stack_20->overflow_arg_area;
        p_Stack_20->overflow_arg_area = local_f8 + 1;
      }
      *(undefined8 *)buff_1._32_8_ = *local_f8;
      *(undefined4 *)(buff_1._32_8_ + 8) = 3;
    }
    else if (cVar1 == 'p') {
      uVar2 = p_Stack_20->gp_offset;
      if (uVar2 < 0x29) {
        local_118 = (undefined8 *)((long)(int)uVar2 + (long)p_Stack_20->reg_save_area);
        p_Stack_20->gp_offset = uVar2 + 8;
      }
      else {
        local_118 = (undefined8 *)p_Stack_20->overflow_arg_area;
        p_Stack_20->overflow_arg_area = local_118 + 1;
      }
      iVar5 = sprintf(local_78,"%p",*local_118);
      pushstr((lua_State *)fmt_local,local_78,(long)iVar5);
    }
    else {
      if (cVar1 != 's') {
        luaG_runerror((lua_State *)fmt_local,"invalid option \'%%%c\' to \'lua_pushfstring\'",
                      (ulong)(uint)(int)s[1]);
      }
      uVar2 = p_Stack_20->gp_offset;
      if (uVar2 < 0x29) {
        local_98 = (long *)((long)(int)uVar2 + (long)p_Stack_20->reg_save_area);
        p_Stack_20->gp_offset = uVar2 + 8;
      }
      else {
        local_98 = (long *)p_Stack_20->overflow_arg_area;
        p_Stack_20->overflow_arg_area = local_98 + 1;
      }
      pcStack_38 = (char *)*local_98;
      if (pcStack_38 == (char *)0x0) {
        pcStack_38 = "(null)";
      }
      str = pcStack_38;
      sVar6 = strlen(pcStack_38);
      pushstr((lua_State *)pcVar4,str,sVar6);
    }
    e._4_4_ = e._4_4_ + 2;
    argp_local = (__va_list_tag *)(s + 2);
  } while( true );
}

Assistant:

const char *luaO_pushvfstring (lua_State *L, const char *fmt, va_list argp) {
  int n = 0;
  for (;;) {
    const char *e = strchr(fmt, '%');
    if (e == NULL) break;
    luaD_checkstack(L, 2);  /* fmt + item */
    pushstr(L, fmt, e - fmt);
    switch (*(e+1)) {
      case 's': {
        const char *s = va_arg(argp, char *);
        if (s == NULL) s = "(null)";
        pushstr(L, s, strlen(s));
        break;
      }
      case 'c': {
        char buff;
        buff = cast(char, va_arg(argp, int));
        pushstr(L, &buff, 1);
        break;
      }
      case 'd': {
        setnvalue(L->top++, cast_num(va_arg(argp, int)));
        break;
      }
      case 'f': {
        setnvalue(L->top++, cast_num(va_arg(argp, l_uacNumber)));
        break;
      }
      case 'p': {
        char buff[4*sizeof(void *) + 8]; /* should be enough space for a `%p' */
        int l = sprintf(buff, "%p", va_arg(argp, void *));
        pushstr(L, buff, l);
        break;
      }
      case '%': {
        pushstr(L, "%", 1);
        break;
      }
      default: {
        luaG_runerror(L,
            "invalid option " LUA_QL("%%%c") " to " LUA_QL("lua_pushfstring"),
            *(e + 1));
      }
    }
    n += 2;
    fmt = e+2;
  }
  luaD_checkstack(L, 1);
  pushstr(L, fmt, strlen(fmt));
  if (n > 0) luaV_concat(L, n + 1);
  return svalue(L->top - 1);
}